

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
Compiler::processIF(Compiler *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *line)

{
  pointer pbVar1;
  pointer pcVar2;
  uint uVar3;
  string local_38;
  
  Scope::reset(&this->expectedScopeType);
  uVar3 = (uint)((ulong)((long)(this->bytecode).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->bytecode).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  (this->expectedScopeType).bytecodeSizeBefore = uVar3;
  (this->expectedScopeType).statementPos = uVar3;
  pbVar1 = (line->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  evaluateBracket(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  InstructionGenerator::genConditionalIf(&this->igen,0);
  (this->expectedScopeType).type = IF;
  return;
}

Assistant:

void Compiler::processIF(const std::vector<std::string>& line)
{
    //Reset the expected scope
    expectedScopeType.reset();

    //Store the bytecode size before the statement
    expectedScopeType.bytecodeSizeBefore = bytecode.size();

    //And the other stuff
    expectedScopeType.statementPos = bytecode.size();
    evaluateBracket(line[1]);
    igen.genConditionalIf(0); //Skip pos will be set later once the scope end point is known
    expectedScopeType.type = Scope::IF;
}